

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb_wrapper_check(void *p)

{
  stb_malloc_record *psVar1;
  int iVar2;
  int iVar3;
  char *file;
  long lVar4;
  int sz;
  char *pcVar5;
  int in_R8D;
  
  if ((p == (void *)0x0) || (iVar2 = stb__hashfind(p), -1 < iVar2)) {
    return;
  }
  if (0 < (long)stb__alloc_size) {
    file = (char *)((long)stb__alloc_size * 0x18);
    pcVar5 = (char *)0x0;
    do {
      if (*(void **)(pcVar5 + (long)&stb__allocations->p) == p) goto LAB_00154ae9;
      pcVar5 = pcVar5 + 0x18;
    } while (file != pcVar5);
  }
  iVar2 = 0x32;
  file = (char *)(ulong)(uint)stb__history_pos;
  do {
    iVar3 = (int)file;
    file = (char *)(ulong)(iVar3 - 1);
    if (iVar3 < 1) {
      file = (char *)0x31;
    }
    if (stb__alloc_history[(int)file].p == p) {
      if (-1 < (int)file) {
        pcVar5 = stb__alloc_history[(long)file].file;
        in_R8D = stb__alloc_history[(long)file].line;
        stb_fatal("Checked %d-byte block %p previously freed/realloced at %s:%d",
                  (ulong)(uint)stb__alloc_history[(long)file].size,p);
        file = pcVar5;
      }
      break;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  stb_fatal("Checked unknown block %p");
LAB_00154ae9:
  pcVar5 = "Internal error: pointer %p was allocated, but hash search failed";
  stb_fatal("Internal error: pointer %p was allocated, but hash search failed");
  if (pcVar5 == (char *)0x0) {
    if ((char *)p != (char *)0x0) {
LAB_00154b90:
      stb__add_alloc(p,sz,file,in_R8D);
      return;
    }
  }
  else if ((char *)p != (char *)0x0) {
    iVar2 = stb__hashfind(pcVar5);
    psVar1 = stb__allocations;
    if (iVar2 == -1) {
      stb__historyfind(pcVar5);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x1d00,"void stb_wrapper_realloc(void *, void *, int, char *, int)");
    }
    if ((char *)p != pcVar5) {
      lVar4 = (long)stb__history_pos;
      pcVar5 = stb__allocations[iVar2].file;
      stb__alloc_history[lVar4].p = stb__allocations[iVar2].p;
      stb__alloc_history[lVar4].file = pcVar5;
      iVar3 = psVar1[iVar2].size;
      stb__alloc_history[lVar4].line = psVar1[iVar2].line;
      stb__alloc_history[lVar4].size = iVar3;
      stb__alloc_history[lVar4].file = file;
      stb__alloc_history[lVar4].line = in_R8D;
      iVar3 = stb__history_pos + 1;
      stb__history_pos = 0;
      if (iVar3 != 0x32) {
        stb__history_pos = iVar3;
      }
      psVar1[iVar2].p = (void *)0x1;
      stb__alloc_count = stb__alloc_count + -1;
      goto LAB_00154b90;
    }
    stb__allocations[iVar2].size = sz;
    psVar1[iVar2].file = file;
    stb__allocations[iVar2].line = in_R8D;
  }
  return;
}

Assistant:

void stb_wrapper_check(void *p)
{
   int n;
   
   if (p == NULL) return;

   n = stb__hashfind(p);

   if (n >= 0) return;

   for (n=0; n < stb__alloc_size; ++n)
      if (stb__allocations[n].p == p)
         stb_fatal("Internal error: pointer %p was allocated, but hash search failed", p);

   // tried to free something that wasn't allocated!
   n = stb__historyfind(p);
   if (n >= 0)
      stb_fatal("Checked %d-byte block %p previously freed/realloced at %s:%d",
                    stb__alloc_history[n].size, p,
                    stb__alloc_history[n].file, stb__alloc_history[n].line);
   stb_fatal("Checked unknown block %p");
}